

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5IndexMerge(Fts5Index *p,Fts5Structure **ppStruct,int nPg,int nMin)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iLvl;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int nRem;
  Fts5Structure *pStruct;
  int local_44;
  Fts5Structure *local_40;
  Fts5Structure **local_38;
  
  local_40 = *ppStruct;
  iVar8 = 0;
  local_44 = nPg;
  local_38 = ppStruct;
  do {
    if ((local_44 < 1) || (p->rc != 0)) break;
    if ((long)local_40->nLevel < 1) {
      iLvl = 0;
      iVar3 = 0;
    }
    else {
      piVar5 = &local_40->aLevel[0].nSeg;
      uVar6 = 0;
      iVar3 = 0;
      uVar4 = 0;
      do {
        iVar1 = ((Fts5StructureLevel *)(piVar5 + -1))->nMerge;
        iVar7 = iVar1;
        if (iVar1 == 0) {
          iVar7 = *piVar5;
        }
        if (iVar3 < iVar7) {
          uVar4 = uVar6 & 0xffffffff;
        }
        iLvl = (int)uVar4;
        if (iVar3 < iVar7) {
          iVar3 = iVar7;
        }
        if (iVar1 != 0) break;
        uVar6 = uVar6 + 1;
        piVar5 = piVar5 + 4;
      } while (uVar6 < (ulong)(long)local_40->nLevel);
    }
    if ((iVar3 < nMin) && (local_40->aLevel[iLvl].nMerge == 0)) {
      bVar2 = false;
    }
    else {
      fts5IndexMergeLevel(p,&local_40,iLvl,&local_44);
      bVar2 = true;
      iVar8 = 1;
      if ((p->rc == 0) && (local_40->aLevel[iLvl].nMerge == 0)) {
        fts5StructurePromote(p,iLvl + 1,local_40);
      }
    }
  } while (bVar2);
  *local_38 = local_40;
  return iVar8;
}

Assistant:

static int fts5IndexMerge(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Current structure of index */
  int nPg,                        /* Pages of work to do */
  int nMin                        /* Minimum number of segments to merge */
){
  int nRem = nPg;
  int bRet = 0;
  Fts5Structure *pStruct = *ppStruct;
  while( nRem>0 && p->rc==SQLITE_OK ){
    int iLvl;                   /* To iterate through levels */
    int iBestLvl = 0;           /* Level offering the most input segments */
    int nBest = 0;              /* Number of input segments on best level */

    /* Set iBestLvl to the level to read input segments from. */
    assert( pStruct->nLevel>0 );
    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      if( pLvl->nMerge ){
        if( pLvl->nMerge>nBest ){
          iBestLvl = iLvl;
          nBest = pLvl->nMerge;
        }
        break;
      }
      if( pLvl->nSeg>nBest ){
        nBest = pLvl->nSeg;
        iBestLvl = iLvl;
      }
    }

    /* If nBest is still 0, then the index must be empty. */
#ifdef SQLITE_DEBUG
    for(iLvl=0; nBest==0 && iLvl<pStruct->nLevel; iLvl++){
      assert( pStruct->aLevel[iLvl].nSeg==0 );
    }
#endif

    if( nBest<nMin && pStruct->aLevel[iBestLvl].nMerge==0 ){
      break;
    }
    bRet = 1;
    fts5IndexMergeLevel(p, &pStruct, iBestLvl, &nRem);
    if( p->rc==SQLITE_OK && pStruct->aLevel[iBestLvl].nMerge==0 ){
      fts5StructurePromote(p, iBestLvl+1, pStruct);
    }
  }
  *ppStruct = pStruct;
  return bRet;
}